

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_375::NinjaMain::ToolUrtle(NinjaMain *this,Options *options,int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  int local_48;
  int local_44;
  char *pcStack_40;
  int i;
  char *p;
  char *pcStack_30;
  int count;
  char *urtle;
  char **argv_local;
  Options *pOStack_18;
  int argc_local;
  Options *options_local;
  NinjaMain *this_local;
  
  pcStack_30 = 
  " 13 ,3;2!2;\n8 ,;<11!;\n5 `\'<10!(2`\'2!\n11 ,6;, `\\. `\\9 .,c13$ec,.\n6 ,2;11!>; `. ,;!2> .e8$2\".2 \"?7$e.\n <:<8!\'` 2.3,.2` ,3!\' ;,(?7\";2!2\'<; `?6$PF ,;,\n2 `\'4!8;<!3\'`2 3! ;,`\'2`2\'3!;4!`2.`!;2 3,2 .<!2\'`).\n5 3`5\'2`9 `!2 `4!><3;5! J2$b,`!>;2!:2!`,d?b`!>\n26 `\'-;,(<9!> $F3 )3.:!.2 d\"2 ) !>\n30 7`2\'<3!- \"=-=\'5 .2 `2-=\",!>\n25 .ze9$er2 .,cd16$bc.\'\n22 .e14$,26$.\n21 z45$c .\n20 J50$c\n20 14$P\"`?34$b\n20 14$ dbc `2\"?22$?7$c\n20 ?18$c.6 4\"8?4\" c8$P\n9 .2,.8 \"20$c.3 ._14 J9$\n .2,2c9$bec,.2 `?21$c.3`4%,3%,3 c8$P\"\n22$c2 2\"?21$bc2,.2` .2,c7$P2\",cb\n23$b bc,.2\"2?14$2F2\"5?2\",J5$P\" ,zd3$\n24$ ?$3?%3 `2\"2?12$bcucd3$P3\"2 2=7$\n23$P\" ,3;<5!>2;,. `4\"6?2\"2 ,9;, `\"?2$\n"
  ;
  p._4_4_ = 0;
  urtle = (char *)argv;
  argv_local._4_4_ = argc;
  pOStack_18 = options;
  options_local = (Options *)this;
  for (pcStack_40 = 
       " 13 ,3;2!2;\n8 ,;<11!;\n5 `\'<10!(2`\'2!\n11 ,6;, `\\. `\\9 .,c13$ec,.\n6 ,2;11!>; `. ,;!2> .e8$2\".2 \"?7$e.\n <:<8!\'` 2.3,.2` ,3!\' ;,(?7\";2!2\'<; `?6$PF ,;,\n2 `\'4!8;<!3\'`2 3! ;,`\'2`2\'3!;4!`2.`!;2 3,2 .<!2\'`).\n5 3`5\'2`9 `!2 `4!><3;5! J2$b,`!>;2!:2!`,d?b`!>\n26 `\'-;,(<9!> $F3 )3.:!.2 d\"2 ) !>\n30 7`2\'<3!- \"=-=\'5 .2 `2-=\",!>\n25 .ze9$er2 .,cd16$bc.\'\n22 .e14$,26$.\n21 z45$c .\n20 J50$c\n20 14$P\"`?34$b\n20 14$ dbc `2\"?22$?7$c\n20 ?18$c.6 4\"8?4\" c8$P\n9 .2,.8 \"20$c.3 ._14 J9$\n .2,2c9$bec,.2 `?21$c.3`4%,3%,3 c8$P\"\n22$c2 2\"?21$bc2,.2` .2,c7$P2\",cb\n23$b bc,.2\"2?14$2F2\"5?2\",J5$P\" ,zd3$\n24$ ?$3?%3 `2\"2?12$bcucd3$P3\"2 2=7$\n23$P\" ,3;<5!>2;,. `4\"6?2\"2 ,9;, `\"?2$\n"
      ; *pcStack_40 != '\0'; pcStack_40 = pcStack_40 + 1) {
    if ((*pcStack_40 < '0') || ('9' < *pcStack_40)) {
      local_44 = 0;
      while( true ) {
        iVar1 = local_44;
        local_48 = 1;
        piVar2 = std::max<int>((int *)((long)&p + 4),&local_48);
        if (*piVar2 <= iVar1) break;
        printf("%c",(ulong)(uint)(int)*pcStack_40);
        local_44 = local_44 + 1;
      }
      p._4_4_ = 0;
    }
    else {
      p._4_4_ = p._4_4_ * 10 + (int)*pcStack_40 + -0x30;
    }
  }
  return 0;
}

Assistant:

int NinjaMain::ToolUrtle(const Options* options, int argc, char** argv) {
  // RLE encoded.
  const char* urtle =
" 13 ,3;2!2;\n8 ,;<11!;\n5 `'<10!(2`'2!\n11 ,6;, `\\. `\\9 .,c13$ec,.\n6 "
",2;11!>; `. ,;!2> .e8$2\".2 \"?7$e.\n <:<8!'` 2.3,.2` ,3!' ;,(?7\";2!2'<"
"; `?6$PF ,;,\n2 `'4!8;<!3'`2 3! ;,`'2`2'3!;4!`2.`!;2 3,2 .<!2'`).\n5 3`5"
"'2`9 `!2 `4!><3;5! J2$b,`!>;2!:2!`,d?b`!>\n26 `'-;,(<9!> $F3 )3.:!.2 d\""
"2 ) !>\n30 7`2'<3!- \"=-='5 .2 `2-=\",!>\n25 .ze9$er2 .,cd16$bc.'\n22 .e"
"14$,26$.\n21 z45$c .\n20 J50$c\n20 14$P\"`?34$b\n20 14$ dbc `2\"?22$?7$c"
"\n20 ?18$c.6 4\"8?4\" c8$P\n9 .2,.8 \"20$c.3 ._14 J9$\n .2,2c9$bec,.2 `?"
"21$c.3`4%,3%,3 c8$P\"\n22$c2 2\"?21$bc2,.2` .2,c7$P2\",cb\n23$b bc,.2\"2"
"?14$2F2\"5?2\",J5$P\" ,zd3$\n24$ ?$3?%3 `2\"2?12$bcucd3$P3\"2 2=7$\n23$P"
"\" ,3;<5!>2;,. `4\"6?2\"2 ,9;, `\"?2$\n";
  int count = 0;
  for (const char* p = urtle; *p; p++) {
    if ('0' <= *p && *p <= '9') {
      count = count*10 + *p - '0';
    } else {
      for (int i = 0; i < max(count, 1); ++i)
        printf("%c", *p);
      count = 0;
    }
  }
  return 0;
}